

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall
chatra::RuntimeImp::push
          (RuntimeImp *this,InstanceId interactiveInstanceId,string *scriptName,string *statement)

{
  uint32_t *puVar1;
  element_type *peVar2;
  Instance *pIVar3;
  __node_base *p_Var4;
  Package *__args_1;
  undefined8 *puVar5;
  UnsupportedOperationException *this_00;
  Thread *__args;
  int local_54;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> local_50;
  string *local_40;
  string *local_38;
  
  local_40 = statement;
  local_38 = scriptName;
  pIVar3 = IdPool<chatra::InstanceId,_chatra::Instance>::lockAndRef
                     (&this->instanceIds,interactiveInstanceId);
  if (pIVar3 != (Instance *)0x0) {
    SpinLock::lock(&pIVar3->lockThreads);
    p_Var4 = &(pIVar3->threads)._M_h._M_before_begin;
    __args = (Thread *)0x0;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      if (*(char *)&(*(_Hash_node_base **)
                      &((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor)[5]._M_nxt ==
          '\x01') {
        if (((ulong)(*(_Hash_node_base **)
                      &((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor)[5]._M_nxt & 0x100
            ) == 0) {
          this_00 = (UnsupportedOperationException *)__cxa_allocate_exception(0x28);
          UnsupportedOperationException::UnsupportedOperationException
                    (this_00,"interaction instance (I%zu) is busy",interactiveInstanceId);
          __cxa_throw(this_00,&UnsupportedOperationException::typeinfo,
                      NativeException::~NativeException);
        }
        __args = *(Thread **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor;
      }
    }
    (pIVar3->lockThreads).flag.super___atomic_flag_base._M_i = false;
    if (__args != (Thread *)0x0) {
      LOCK();
      (__args->readyToNextInteraction)._M_base._M_i = false;
      UNLOCK();
      __args_1 = IdPool<chatra::PackageId,_chatra::Package>::lockAndRef
                           (&this->packageIds,pIVar3->primaryPackageId);
      std::vector<chatra::Script,std::allocator<chatra::Script>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((vector<chatra::Script,std::allocator<chatra::Script>> *)
                 &__args_1->super_PackageInfo,local_38,local_40);
      SpinLock::lock(&this->lockTrashNodes);
      std::forward_list<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
      ::emplace_front<std::shared_ptr<chatra::Node>>
                ((forward_list<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                  *)&this->trashNodes,&__args_1->node);
      std::make_shared<chatra::Node>();
      std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(__args_1->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>,
                 &local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      peVar2 = (__args_1->node).super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2->type = ScriptRoot;
      puVar1 = &peVar2->flags;
      *(byte *)puVar1 = (byte)*puVar1 | 4;
      (this->lockTrashNodes).flag.super___atomic_flag_base._M_i = false;
      local_54 = 1;
      local_50._M_ptr =
           (element_type *)
           (__args_1->scope)._M_t.
           super___uniq_ptr_impl<chatra::Scope,_std::default_delete<chatra::Scope>_>._M_t.
           super__Tuple_impl<0UL,_chatra::Scope_*,_std::default_delete<chatra::Scope>_>.
           super__Head_base<0UL,_chatra::Scope_*,_false>._M_head_impl;
      std::vector<chatra::Frame,std::allocator<chatra::Frame>>::
      emplace_back<chatra::Thread&,chatra::Package&,int,chatra::Scope*>
                ((vector<chatra::Frame,std::allocator<chatra::Frame>> *)&__args->frames,__args,
                 __args_1,&local_54,(Scope **)&local_50);
      Package::pushNodeFrame
                (__args_1,__args,__args_1,2,
                 (__args->scriptScope)._M_t.
                 super___uniq_ptr_impl<chatra::Scope,_std::default_delete<chatra::Scope>_>._M_t.
                 super__Tuple_impl<0UL,_chatra::Scope_*,_std::default_delete<chatra::Scope>_>.
                 super__Head_base<0UL,_chatra::Scope_*,_false>._M_head_impl,2);
      LOCK();
      (__args_1->initialized)._M_base._M_i = false;
      UNLOCK();
      __args_1->grouped = false;
      (__args->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].phase = 0x7ffffffffffffffc;
      enqueue(this,__args);
      return;
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
  puVar5[2] = 0;
  puVar5[3] = 0;
  puVar5[4] = 0;
  puVar5[1] = puVar5 + 3;
  *(undefined1 *)(puVar5 + 3) = 0;
  *puVar5 = &PTR__NativeException_0023ce78;
  __cxa_throw(puVar5,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

void RuntimeImp::push(InstanceId interactiveInstanceId, const std::string& scriptName,
		const std::string& statement) {

	auto* instance = instanceIds.lockAndRef(interactiveInstanceId);
	if (instance == nullptr)
		throw IllegalArgumentException();

	Thread* thread = nullptr;
	{
		std::lock_guard<SpinLock> lock0(instance->lockThreads);
		for (auto& e : instance->threads) {
			auto& t = e.second;
			if (!t->isInteractive)
				continue;
			if (!t->readyToNextInteraction.load())
				throw UnsupportedOperationException("interaction instance (I%zu) is busy",
						static_cast<size_t>(interactiveInstanceId));
			thread = t.get();
		}
	}
	if (thread == nullptr)
		throw IllegalArgumentException();

	thread->readyToNextInteraction = false;

	auto* package = packageIds.lockAndRef(instance->primaryPackageId);
	package->scripts.emplace_back(scriptName, statement);

	{
		std::lock_guard<SpinLock> lock0(lockTrashNodes);
		trashNodes.emplace_front(std::move(package->node));
		package->node = std::make_shared<Node>();
		package->node->type = NodeType::ScriptRoot;
		package->node->flags |= NodeFlags::InitialNode;
	}

	chatra_assert(thread->frames.size() == residentialFrameCount);
	thread->frames.emplace_back(*thread, *package, 1, package->scope.get());
	package->pushNodeFrame(*thread, *package, 2, thread->scriptScope.get(), 2);

	package->initialized = false;
	package->grouped = false;

	auto& f = thread->frames.back();
	chatra_assert(f.stack.empty());
	f.phase = Phase::ScriptRoot_InteractiveInitial;

	enqueue(thread);
}